

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<long>(uint length,long value)

{
  undefined8 *puVar1;
  _func_int ***ppp_Var2;
  undefined8 uVar3;
  long lVar4;
  uint i;
  long *plVar5;
  undefined1 (*pauVar6) [16];
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  undefined8 *puVar11;
  int iVar12;
  int iVar13;
  int len;
  undefined4 in_register_0000003c;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 (*local_60) [16];
  shared_ptr<long> pa;
  shared_ptr<long> pb;
  
  pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000003c,length);
  plVar5 = nosimd::common::malloc<long>(length + 1);
  std::__shared_ptr<long,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<long,void(*)(long*),void>
            ((__shared_ptr<long,(__gnu_cxx::_Lock_policy)2> *)&local_60,plVar5,
             nosimd::common::free<long>);
  plVar5 = nosimd::common::malloc<long>(length + 1);
  std::__shared_ptr<long,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<long,void(*)(long*),void>
            ((__shared_ptr<long,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,plVar5,
             nosimd::common::free<long>);
  len = (int)pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar14 = (ulong)pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
           0xffffffff;
  *(undefined8 *)(*local_60 + uVar14 * 8) = 0x7f;
  (&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar14] = (_func_int **)0x3f;
  auVar15._8_4_ = (int)value;
  auVar15._0_8_ = value;
  auVar15._12_4_ = (int)((ulong)value >> 0x20);
  iVar13 = len >> 1;
  pauVar6 = local_60;
  for (iVar12 = iVar13; 3 < iVar12; iVar12 = iVar12 + -4) {
    *pauVar6 = auVar15;
    pauVar6[1] = auVar15;
    pauVar6[2] = auVar15;
    pauVar6[3] = auVar15;
    pauVar6 = pauVar6 + 4;
  }
  if (1 < iVar12) {
    *pauVar6 = auVar15;
    pauVar6[1] = auVar15;
    iVar12 = iVar12 + -2;
    pauVar6 = pauVar6 + 2;
  }
  if (iVar12 != 0) {
    *pauVar6 = auVar15;
  }
  lVar7 = (long)len;
  if (len != 0) {
    *(long *)(local_60[-1] + lVar7 * 8 + 8) = value;
  }
  uVar10 = 0;
  while (uVar14 != uVar10) {
    lVar9 = uVar10 * 8;
    uVar10 = uVar10 + 1;
    if (*(long *)(*local_60 + lVar9) != value) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar8 = "void test_common(unsigned int, T) [T = long]";
      *(undefined4 *)(puVar8 + 1) = 0x16;
      *(int *)((long)puVar8 + 0xc) = len;
      __cxa_throw(puVar8,&Exception::typeinfo,0);
    }
  }
  lVar9 = 0;
  for (iVar12 = iVar13; 3 < iVar12; iVar12 = iVar12 + -4) {
    uVar3 = *(undefined8 *)((long)(*local_60 + lVar9) + 8);
    puVar8 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base + lVar9);
    *puVar8 = *(undefined8 *)(*local_60 + lVar9);
    puVar8[1] = uVar3;
    uVar3 = *(undefined8 *)((long)(local_60[1] + lVar9) + 8);
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                     _vptr__Sp_counted_base + lVar9);
    *puVar8 = *(undefined8 *)(local_60[1] + lVar9);
    puVar8[1] = uVar3;
    uVar3 = *(undefined8 *)((long)(local_60[2] + lVar9) + 8);
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base + lVar9);
    *puVar8 = *(undefined8 *)(local_60[2] + lVar9);
    puVar8[1] = uVar3;
    uVar3 = *(undefined8 *)((long)(local_60[3] + lVar9) + 8);
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
                     _vptr__Sp_counted_base + lVar9);
    *puVar8 = *(undefined8 *)(local_60[3] + lVar9);
    puVar8[1] = uVar3;
    lVar9 = lVar9 + 0x40;
  }
  if (iVar12 < 2) {
    puVar8 = (undefined8 *)(*local_60 + lVar9);
    puVar11 = (undefined8 *)
              ((long)&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar9);
  }
  else {
    puVar1 = (undefined8 *)(*local_60 + lVar9);
    puVar8 = puVar1 + 4;
    uVar3 = puVar1[1];
    puVar11 = (undefined8 *)
              ((long)&pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                      _vptr__Sp_counted_base + lVar9);
    puVar11[-4] = *puVar1;
    puVar11[-3] = uVar3;
    uVar3 = puVar1[3];
    puVar11[-2] = puVar1[2];
    puVar11[-1] = uVar3;
    iVar12 = iVar12 + -2;
  }
  if (iVar12 != 0) {
    uVar3 = puVar8[1];
    *puVar11 = *puVar8;
    puVar11[1] = uVar3;
  }
  if (len != 0) {
    *(undefined8 *)
     ((long)pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar7 * 8 + -8) = *(undefined8 *)(local_60[-1] + lVar7 * 8 + 8);
  }
  uVar10 = 0;
  while (uVar14 != uVar10) {
    ppp_Var2 = &(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar10;
    uVar10 = uVar10 + 1;
    if (*ppp_Var2 != (_func_int **)value) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar8 = "void test_common(unsigned int, T) [T = long]";
      *(undefined4 *)(puVar8 + 1) = 0x1d;
      *(int *)((long)puVar8 + 0xc) = len;
      __cxa_throw(puVar8,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<long>
            ((long *)pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,len);
  uVar10 = 0;
  while (iVar12 = (int)pb.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
        uVar14 != uVar10) {
    ppp_Var2 = &(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar10;
    uVar10 = uVar10 + 1;
    if (*ppp_Var2 != (_func_int **)0x0) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar8 = "void test_common(unsigned int, T) [T = long]";
      *(undefined4 *)(puVar8 + 1) = 0x24;
      *(int *)((long)puVar8 + 0xc) = iVar12;
      __cxa_throw(puVar8,&Exception::typeinfo,0);
    }
  }
  for (uVar10 = 0; uVar14 != uVar10; uVar10 = uVar10 + 1) {
    *(ulong *)(*local_60 + uVar10 * 8) = uVar10;
  }
  lVar9 = 0;
  for (; 3 < iVar13; iVar13 = iVar13 + -4) {
    uVar3 = *(undefined8 *)((long)(*local_60 + lVar9) + 8);
    puVar8 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                     _vptr__Sp_counted_base + lVar9);
    *puVar8 = *(undefined8 *)(*local_60 + lVar9);
    puVar8[1] = uVar3;
    uVar3 = *(undefined8 *)((long)(local_60[1] + lVar9) + 8);
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
                     _vptr__Sp_counted_base + lVar9);
    *puVar8 = *(undefined8 *)(local_60[1] + lVar9);
    puVar8[1] = uVar3;
    uVar3 = *(undefined8 *)((long)(local_60[2] + lVar9) + 8);
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                     _vptr__Sp_counted_base + lVar9);
    *puVar8 = *(undefined8 *)(local_60[2] + lVar9);
    puVar8[1] = uVar3;
    uVar3 = *(undefined8 *)((long)(local_60[3] + lVar9) + 8);
    puVar8 = (undefined8 *)
             ((long)&pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
                     _vptr__Sp_counted_base + lVar9);
    *puVar8 = *(undefined8 *)(local_60[3] + lVar9);
    puVar8[1] = uVar3;
    lVar9 = lVar9 + 0x40;
  }
  if (iVar13 < 2) {
    puVar8 = (undefined8 *)(*local_60 + lVar9);
    puVar11 = (undefined8 *)
              ((long)&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar9);
  }
  else {
    puVar1 = (undefined8 *)(*local_60 + lVar9);
    puVar8 = puVar1 + 4;
    uVar3 = puVar1[1];
    puVar11 = (undefined8 *)
              ((long)&pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
                      _vptr__Sp_counted_base + lVar9);
    puVar11[-4] = *puVar1;
    puVar11[-3] = uVar3;
    uVar3 = puVar1[3];
    puVar11[-2] = puVar1[2];
    puVar11[-1] = uVar3;
    iVar13 = iVar13 + -2;
  }
  if (iVar13 != 0) {
    uVar3 = puVar8[1];
    *puVar11 = *puVar8;
    puVar11[1] = uVar3;
  }
  if (iVar12 != 0) {
    *(undefined8 *)
     ((long)pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     lVar7 * 8 + -8) = *(undefined8 *)(local_60[-1] + lVar7 * 8 + 8);
  }
  lVar7 = -1;
  while (lVar7 - uVar14 != -1) {
    lVar9 = lVar7 + 1;
    lVar4 = lVar7 * 2;
    lVar7 = lVar9;
    if (lVar9 != *(long *)(&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_M_use_count + lVar4)) {
      puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar8 = "void test_common(unsigned int, T) [T = long]";
      *(undefined4 *)(puVar8 + 1) = 0x2d;
      *(int *)((long)puVar8 + 0xc) = iVar12;
      __cxa_throw(puVar8,&Exception::typeinfo,0);
    }
  }
  if ((*(long *)(*local_60 + uVar14 * 8) == 0x7f) &&
     ((&(pa.super___shared_ptr<long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar14] == (_func_int **)0x3f)) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar8 = "void test_common(unsigned int, T) [T = long]";
  *(undefined4 *)(puVar8 + 1) = 0x31;
  *(int *)((long)puVar8 + 0xc) = iVar12;
  __cxa_throw(puVar8,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}